

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# R3_binary_search_tree.c
# Opt level: O0

NODE * insert(NODE **p,KEY key)

{
  int iVar1;
  NODE *pNVar2;
  NODE *new;
  node **ppnStack_18;
  KEY key_local;
  NODE **p_local;
  
  ppnStack_18 = p;
  while( true ) {
    if (*ppnStack_18 == (NODE *)0x0) {
      pNVar2 = (NODE *)malloc(0x18);
      if (pNVar2 != (NODE *)0x0) {
        pNVar2->data = key;
        pNVar2->left = (node *)0x0;
        pNVar2->right = (node *)0x0;
        *ppnStack_18 = pNVar2;
        return pNVar2;
      }
      printf("Out of memory\n");
      exit(1);
    }
    iVar1 = keyequal(key,(*ppnStack_18)->data);
    if (iVar1 != 0) break;
    iVar1 = keylt(key,(*ppnStack_18)->data);
    if (iVar1 == 0) {
      ppnStack_18 = &(*ppnStack_18)->right;
    }
    else {
      ppnStack_18 = &(*ppnStack_18)->left;
    }
  }
  return (NODE *)0x0;
}

Assistant:

NODE *insert(NODE **p, KEY key) {
  NODE *new;
  while (*p != NULL) {
    if (keyequal(key, (*p)->data)) {
      return NULL;
    } else if (keylt(key, (*p)->data)) {
      p = &(*p)->left;
    } else {
      p = &(*p)->right;
    }
  }

  if ((new = (NODE *)malloc(sizeof(NODE))) == NULL) {
    printf("Out of memory\n");
    exit(1);
  }

  new->data = key;
  new->left = NULL;
  new->right = NULL;

  *p = new;
  return new;
}